

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<AST::BlockStmt,_std::default_delete<AST::BlockStmt>_> __thiscall
Parser::parseBlockStmt(Parser *this)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  pointer pcVar4;
  pointer *__ptr;
  Parser *in_RSI;
  vector<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>,_std::allocator<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>_>_>
  statements;
  undefined1 local_58 [32];
  vector<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>,_std::allocator<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>_>_>
  local_38;
  
  eatToken(in_RSI,LeftBrace);
  local_38.
  super__Vector_base<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>,_std::allocator<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>,_std::allocator<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>,_std::allocator<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while ((in_RSI->m_currToken).type != RightBrace) {
    parseStmt((Parser *)local_58);
    std::
    vector<std::unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>>,std::allocator<std::unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>>>>
    ::emplace_back<std::unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>>>
              ((vector<std::unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>>,std::allocator<std::unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>>>>
                *)&local_38,(unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_> *)local_58);
    if ((long *)local_58._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_58._0_8_ + 8))();
    }
    eatToken(in_RSI,EOL);
  }
  eatToken(in_RSI,RightBrace);
  pcVar4 = (pointer)operator_new(0x20);
  puVar3 = local_38.
           super__Vector_base<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>,_std::allocator<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  puVar2 = local_38.
           super__Vector_base<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>,_std::allocator<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar1 = local_38.
           super__Vector_base<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>,_std::allocator<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_38.
  super__Vector_base<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>,_std::allocator<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>,_std::allocator<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>,_std::allocator<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined ***)pcVar4 = &PTR__BlockStmt_00182a08;
  *(pointer *)(pcVar4 + 8) = puVar1;
  *(pointer *)(pcVar4 + 0x10) = puVar2;
  *(pointer *)(pcVar4 + 0x18) = puVar3;
  local_58._16_8_ = 0;
  local_58._0_8_ = (pointer)0x0;
  local_58._8_8_ = (pointer)0x0;
  (this->m_lexer).m_input._M_dataplus._M_p = pcVar4;
  std::
  vector<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>,_std::allocator<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>_>_>
  ::~vector((vector<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>,_std::allocator<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>_>_>
             *)local_58);
  std::
  vector<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>,_std::allocator<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>_>_>
  ::~vector(&local_38);
  return (__uniq_ptr_data<AST::BlockStmt,_std::default_delete<AST::BlockStmt>,_true,_true>)
         (__uniq_ptr_data<AST::BlockStmt,_std::default_delete<AST::BlockStmt>,_true,_true>)this;
}

Assistant:

std::unique_ptr<AST::BlockStmt> Parser::parseBlockStmt() {
    eatToken(TokenType::LeftBrace);
    std::vector<std::unique_ptr<AST::Stmt>> statements;
    while (m_currToken.type != TokenType::RightBrace) {
        statements.push_back(parseStmt());
        eatToken(TokenType::EOL);
    }
    eatToken(TokenType::RightBrace);
    return std::make_unique<AST::BlockStmt>(std::move(statements));
}